

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_toggle.c
# Opt level: O0

void toggle_draw_update(t_toggle *x,_glist *glist)

{
  int iVar1;
  _glist *p_Var2;
  int local_ac;
  char local_a8 [8];
  char tag [128];
  int col;
  _glist *canvas;
  _glist *glist_local;
  t_toggle *x_local;
  
  iVar1 = glist_isvisible(glist);
  if (iVar1 != 0) {
    p_Var2 = glist_getcanvas(glist);
    if ((x->x_on != 0.0) || (NAN(x->x_on))) {
      local_ac = (x->x_gui).x_fcol;
    }
    else {
      local_ac = (x->x_gui).x_bcol;
    }
    tag[0x7c] = (undefined1)local_ac;
    tag[0x7d] = local_ac._1_1_;
    tag[0x7e] = local_ac._2_1_;
    tag[0x7f] = local_ac._3_1_;
    sprintf(local_a8,"%lxX1",x);
    pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_a8,"-fill",tag._124_4_);
    sprintf(local_a8,"%lxX2",x);
    pdgui_vmess((char *)0x0,"crs rk",p_Var2,"itemconfigure",local_a8,"-fill",tag._124_4_);
  }
  return;
}

Assistant:

void toggle_draw_update(t_toggle *x, t_glist *glist)
{
    if(glist_isvisible(glist))
    {
        t_canvas *canvas = glist_getcanvas(glist);
        int col = (x->x_on != 0.0) ? x->x_gui.x_fcol : x->x_gui.x_bcol;
        char tag[128];

        sprintf(tag, "%lxX1", x);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", col);
        sprintf(tag, "%lxX2", x);
        pdgui_vmess(0, "crs rk", canvas, "itemconfigure", tag, "-fill", col);
    }
}